

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void __thiscall PrintfTest_NoArgs_Test::TestBody(PrintfTest_NoArgs_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string_view format;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  internal local_890 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_888;
  undefined1 local_880 [32];
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  local_860;
  undefined4 local_828 [6];
  undefined1 local_810 [32];
  undefined1 local_7f0 [2000];
  
  format.size_ = 4;
  format.data_ = "test";
  test_sprintf<>((string *)local_810,format);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_860,"\"test\"","test_sprintf(\"test\")",(char (*) [5])0x20e6ad,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_810);
  if ((undefined1 *)local_810._0_8_ != local_810 + 0x10) {
    operator_delete((void *)local_810._0_8_);
  }
  if (local_860.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_810);
    if ((undefined8 *)
        local_860.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_860.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_880,(Message *)local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_880);
    if ((long *)local_810._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_810._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_810._0_8_ + 8))();
      }
      local_810._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_860.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
        *)local_828;
  local_828[0] = 0;
  local_810._16_8_ = 0;
  local_810._0_8_ = &PTR_grow_00241000;
  local_810._24_8_ = 500;
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .parse_context_.format_str_.data_ = L"test";
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .parse_context_.format_str_.size_ = 4;
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .parse_context_.next_arg_id_ = 0;
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
       ::TYPES;
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .loc_.locale_ = (void *)0x0;
  local_860.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  .out_.container = (basic_buffer<wchar_t> *)local_810;
  local_810._8_8_ = local_7f0;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  ::format(&local_860);
  local_880._0_8_ = (AssertHelperData *)(local_880 + 0x10);
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_880,local_810._8_8_,
             (undefined1 *)(local_810._8_8_ + local_810._16_8_ * 4));
  local_810._0_8_ = &PTR_grow_00241000;
  if ((undefined1 *)local_810._8_8_ != local_7f0) {
    operator_delete((void *)local_810._8_8_);
  }
  testing::internal::CmpHelperEQ<wchar_t[5],std::__cxx11::wstring>
            (local_890,"L\"test\"","fmt::sprintf(L\"test\")",(wchar_t (*) [5])L"test",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_880
            );
  if ((AssertHelperData *)local_880._0_8_ != (AssertHelperData *)(local_880 + 0x10)) {
    operator_delete((void *)local_880._0_8_);
  }
  if (local_890[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_810);
    if (local_888.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_888.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_860,(Message *)local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_860);
    if ((undefined **)local_810._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_810._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_810._0_8_ + 8))();
      }
      local_810._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_888,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(PrintfTest, NoArgs) {
  EXPECT_EQ("test", test_sprintf("test"));
  EXPECT_EQ(L"test", fmt::sprintf(L"test"));
}